

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NewCommit.h
# Opt level: O3

string * __thiscall
NewCommit::FormatIndexFile
          (string *__return_storage_ptr__,NewCommit *this,string *fileString,string *commit)

{
  ulong *puVar1;
  long *plVar2;
  int iVar3;
  undefined8 *puVar4;
  ulong uVar5;
  ulong uVar6;
  string word;
  ulong *local_d0;
  long local_c8;
  ulong local_c0;
  undefined8 uStack_b8;
  long *local_b0;
  undefined8 local_a8;
  long local_a0;
  undefined8 uStack_98;
  ulong *local_90;
  long local_88;
  ulong local_80 [2];
  ulong *local_70;
  long local_68;
  ulong local_60 [2];
  ulong *local_50;
  long local_48;
  ulong local_40 [2];
  
  std::operator+(__return_storage_ptr__,"commit ",commit);
  if (fileString->_M_string_length != 4) {
    uVar5 = 0;
    do {
      std::__cxx11::string::substr((ulong)&local_50,(ulong)fileString);
      std::__cxx11::string::substr((ulong)&local_70,(ulong)fileString);
      uVar6 = 0xf;
      if (local_50 != local_40) {
        uVar6 = local_40[0];
      }
      if (uVar6 < (ulong)(local_68 + local_48)) {
        uVar6 = 0xf;
        if (local_70 != local_60) {
          uVar6 = local_60[0];
        }
        if (uVar6 < (ulong)(local_68 + local_48)) goto LAB_0010b34a;
        puVar4 = (undefined8 *)
                 std::__cxx11::string::replace((ulong)&local_70,0,(char *)0x0,(ulong)local_50);
      }
      else {
LAB_0010b34a:
        puVar4 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_50,(ulong)local_70);
      }
      puVar1 = puVar4 + 2;
      if ((ulong *)*puVar4 == puVar1) {
        local_c0 = *puVar1;
        uStack_b8 = puVar4[3];
        local_d0 = &local_c0;
      }
      else {
        local_c0 = *puVar1;
        local_d0 = (ulong *)*puVar4;
      }
      local_c8 = puVar4[1];
      *puVar4 = puVar1;
      puVar4[1] = 0;
      *(undefined1 *)puVar1 = 0;
      std::__cxx11::string::substr((ulong)&local_90,(ulong)fileString);
      uVar6 = 0xf;
      if (local_d0 != &local_c0) {
        uVar6 = local_c0;
      }
      if (uVar6 < (ulong)(local_88 + local_c8)) {
        uVar6 = 0xf;
        if (local_90 != local_80) {
          uVar6 = local_80[0];
        }
        if (uVar6 < (ulong)(local_88 + local_c8)) goto LAB_0010b409;
        puVar4 = (undefined8 *)
                 std::__cxx11::string::replace((ulong)&local_90,0,(char *)0x0,(ulong)local_d0);
      }
      else {
LAB_0010b409:
        puVar4 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_d0,(ulong)local_90);
      }
      plVar2 = puVar4 + 2;
      if ((long *)*puVar4 == plVar2) {
        local_a0 = *plVar2;
        uStack_98 = puVar4[3];
        local_b0 = &local_a0;
      }
      else {
        local_a0 = *plVar2;
        local_b0 = (long *)*puVar4;
      }
      local_a8 = puVar4[1];
      *puVar4 = plVar2;
      puVar4[1] = 0;
      *(undefined1 *)plVar2 = 0;
      if (local_90 != local_80) {
        operator_delete(local_90,local_80[0] + 1);
      }
      if (local_d0 != &local_c0) {
        operator_delete(local_d0,local_c0 + 1);
      }
      if (local_70 != local_60) {
        operator_delete(local_70,local_60[0] + 1);
      }
      if (local_50 != local_40) {
        operator_delete(local_50,local_40[0] + 1);
      }
      iVar3 = std::__cxx11::string::compare((char *)&local_b0);
      if (iVar3 == 0) {
        std::__cxx11::string::append((char *)__return_storage_ptr__);
      }
      std::__cxx11::string::push_back((char)__return_storage_ptr__);
      if (local_b0 != &local_a0) {
        operator_delete(local_b0,local_a0 + 1);
      }
      uVar5 = uVar5 + 1;
    } while (uVar5 < fileString->_M_string_length - 4);
  }
  return __return_storage_ptr__;
}

Assistant:

string FormatIndexFile(string fileString, string commit) {
        string result = "commit " + commit;
        for (int i = 0; i < fileString.length() - 4; i++) {
            string word = fileString.substr(i, 1) + fileString.substr(i + 1, 1) + fileString.substr(i + 2, 1);
            if (word == "add") {
                result += "\n";
            }
            result += fileString[i];
        }

        return result;
    }